

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSSBOArrayLengthTests.cpp
# Opt level: O2

int __thiscall
deqp::gles31::Functional::SSBOArrayLengthTests::init(SSBOArrayLengthTests *this,EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  undefined4 uVar2;
  char *__rhs;
  TestCase *this_00;
  long lVar3;
  allocator<char> local_f1;
  long local_f0;
  long local_e8;
  char *local_e0;
  char *local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  string desc;
  string name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  for (local_e8 = 0; local_e8 != 2; local_e8 = local_e8 + 1) {
    bVar1 = init::arraysSized[local_e8];
    local_d8 = "unsized_";
    if (bVar1 != false) {
      local_d8 = "sized_";
    }
    local_e0 = "unsized ";
    if (bVar1 != false) {
      local_e0 = "sized ";
    }
    lVar3 = 8;
    while (lVar3 != 0x50) {
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      local_d0._M_string_length = 0;
      local_d0.field_2._M_local_buf[0] = '\0';
      std::operator+(&local_50,&local_d0,local_d8);
      __rhs = *(char **)((long)&init::qualifiers[0].access + lVar3);
      local_f0 = lVar3;
      std::operator+(&desc,&local_50,__rhs);
      std::operator+(&name,&desc,"array");
      std::__cxx11::string::~string((string *)&desc);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_70,"Test length() of ",&local_f1);
      std::operator+(&local_d0,&local_70,local_e0);
      std::operator+(&local_50,&local_d0,__rhs);
      std::operator+(&desc,&local_50," array");
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_70);
      this_00 = (TestCase *)operator_new(0x90);
      uVar2 = *(undefined4 *)(&UNK_00a0e6c8 + local_f0);
      TestCase::TestCase(this_00,(this->super_TestCaseGroup).m_context,name._M_dataplus._M_p,
                         desc._M_dataplus._M_p);
      (this_00->super_TestCase).super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__SSBOArrayLengthCase_00a0e740;
      *(undefined4 *)&this_00[1].super_TestCase.super_TestNode._vptr_TestNode = uVar2;
      *(bool *)((long)&this_00[1].super_TestCase.super_TestNode._vptr_TestNode + 4) = bVar1;
      this_00[1].super_TestCase.super_TestNode.m_testCtx = (TestContext *)0x0;
      this_00[1].super_TestCase.super_TestNode.m_name._M_dataplus._M_p = (pointer)0x0;
      tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
      std::__cxx11::string::~string((string *)&desc);
      std::__cxx11::string::~string((string *)&name);
      lVar3 = local_f0 + 0x18;
    }
  }
  return 2;
}

Assistant:

void SSBOArrayLengthTests::init (void)
{
	static const struct Qualifier
	{
		SSBOArrayLengthCase::ArrayAccess	access;
		const char*							name;
		const char*							desc;
	}  qualifiers[] =
	{
		{ SSBOArrayLengthCase::ACCESS_DEFAULT,		"",				""			},
		{ SSBOArrayLengthCase::ACCESS_WRITEONLY,	"writeonly_",	"writeonly"	},
		{ SSBOArrayLengthCase::ACCESS_READONLY,		"readonly_",	"readonly"	},
	};

	static const bool arraysSized[]	= { true, false };

	for (int sizeNdx = 0; sizeNdx < DE_LENGTH_OF_ARRAY(arraysSized); ++sizeNdx)
	for (int qualifierNdx = 0; qualifierNdx < DE_LENGTH_OF_ARRAY(qualifiers); ++qualifierNdx)
	{
		const std::string name = std::string() + ((arraysSized[sizeNdx]) ? ("sized_") : ("unsized_")) + qualifiers[qualifierNdx].name + "array";
		const std::string desc = std::string("Test length() of ") + ((arraysSized[sizeNdx]) ? ("sized ") : ("unsized ")) + qualifiers[qualifierNdx].name + " array";

		this->addChild(new SSBOArrayLengthCase(m_context, name.c_str(), desc.c_str(), qualifiers[qualifierNdx].access, arraysSized[sizeNdx]));
	}
}